

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O3

string * __thiscall
flatbuffers::GetAnyFieldS_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,Table *table,Field *field,Schema *schema
          )

{
  ushort uVar1;
  ushort uVar2;
  flatbuffers *this_00;
  long lVar3;
  ulong uVar4;
  Schema *schema_00;
  Table *pTVar5;
  
  lVar3 = -(long)*(int *)table;
  uVar1 = *(ushort *)(table + -(long)*(int *)table);
  if ((uVar1 < 0xb) || ((ulong)*(ushort *)(table + lVar3 + 10) == 0)) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)(table + *(ushort *)(table + lVar3 + 10));
  }
  if ((uVar2 < *(ushort *)(this + -(long)*(int *)this)) &&
     (*(ushort *)(this + ((ulong)uVar2 - (long)*(int *)this)) != 0)) {
    this_00 = (flatbuffers *)0x0;
    if ((uVar1 < 7) || (uVar4 = (ulong)*(ushort *)(table + lVar3 + 6), uVar4 == 0)) {
      pTVar5 = (Table *)0x0;
    }
    else {
      pTVar5 = table + *(uint *)(table + uVar4) + uVar4;
    }
    if ((4 < *(ushort *)(pTVar5 + -(long)*(int *)pTVar5)) &&
       ((ulong)*(ushort *)(pTVar5 + (4 - (long)*(int *)pTVar5)) != 0)) {
      this_00 = (flatbuffers *)
                (ulong)(uint)(int)(char)pTVar5[*(ushort *)(pTVar5 + (4 - (long)*(int *)pTVar5))];
    }
    if ((uVar1 < 7) || (uVar4 = (ulong)*(ushort *)(table + lVar3 + 6), uVar4 == 0)) {
      pTVar5 = (Table *)0x0;
    }
    else {
      pTVar5 = table + *(uint *)(table + uVar4) + uVar4;
    }
    schema_00 = (Schema *)0xffffffff;
    if ((8 < *(ushort *)(pTVar5 + -(long)*(int *)pTVar5)) &&
       ((ulong)*(ushort *)(pTVar5 + (8 - (long)*(int *)pTVar5)) != 0)) {
      schema_00 = (Schema *)
                  (ulong)*(uint *)(pTVar5 + *(ushort *)(pTVar5 + (8 - (long)*(int *)pTVar5)));
    }
    GetAnyValueS_abi_cxx11_
              (__return_storage_ptr__,this_00,
               (int)this + (uint)*(ushort *)(this + ((ulong)uVar2 - (long)*(int *)this)),
               (uint8_t *)field,schema_00,(int)(pTVar5 + -(long)*(int *)pTVar5));
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetAnyFieldS(const Table &table,
                                const reflection::Field &field,
                                const reflection::Schema *schema) {
  auto field_ptr = table.GetAddressOf(field.offset());
  return field_ptr ? GetAnyValueS(field.type()->base_type(), field_ptr, schema,
                                  field.type()->index())
                   : "";
}